

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int get_push_size(uchar *bytes,size_t bytes_len,_Bool get_opcode_size,size_t *size_out)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (size_out == (size_t *)0x0 || (bytes_len == 0 || bytes == (uchar *)0x0)) {
    return -2;
  }
  bVar1 = *bytes;
  sVar4 = (size_t)bVar1;
  if (sVar4 < 0x4c) {
    sVar2 = 1;
  }
  else if (sVar4 == 0x4e) {
    if (bytes_len < 5) {
      return -2;
    }
    sVar4 = (size_t)*(uint *)(bytes + 1);
    sVar2 = 5;
  }
  else if (bVar1 == 0x4d) {
    if (bytes_len < 3) {
      return -2;
    }
    sVar4 = (size_t)*(ushort *)(bytes + 1);
    sVar2 = 3;
  }
  else {
    if (bVar1 != 0x4c) {
      return -2;
    }
    if (bytes_len < 2) {
      return -2;
    }
    sVar4 = (size_t)bytes[1];
    sVar2 = 2;
  }
  sVar3 = sVar2;
  if (!get_opcode_size) {
    sVar3 = sVar4;
  }
  if (bytes_len < sVar4 + sVar2) {
    sVar3 = sVar4;
  }
  *size_out = sVar3;
  return (uint)(sVar4 + sVar2 <= bytes_len) * 2 + -2;
}

Assistant:

static int get_push_size(const unsigned char *bytes, size_t bytes_len,
                         bool get_opcode_size, size_t *size_out)
{
    size_t opcode_len;

    if (!bytes || !bytes_len || !size_out)
        return WALLY_EINVAL;

    if (bytes[0] < 76) {
        opcode_len = 1;
        *size_out = bytes[0];
    } else if (bytes[0] == OP_PUSHDATA1) {
        opcode_len = 2;
        if (bytes_len < opcode_len)
            return WALLY_EINVAL;
        *size_out = bytes[1];
    } else if (bytes[0] == OP_PUSHDATA2) {
        leint16_t data_len;
        opcode_len = 3;
        if (bytes_len < opcode_len)
            return WALLY_EINVAL;
        memcpy(&data_len, &bytes[1], sizeof(data_len));
        *size_out = le16_to_cpu(data_len);
    } else if (bytes[0] == OP_PUSHDATA4) {
        leint32_t data_len;
        opcode_len = 5;
        if (bytes_len < opcode_len)
            return WALLY_EINVAL;
        memcpy(&data_len, &bytes[1], sizeof(data_len));
        *size_out = le32_to_cpu(data_len);
    } else
        return WALLY_EINVAL; /* Not a push */
    if (bytes_len < opcode_len + *size_out)
        return WALLY_EINVAL; /* Push is longer than current script bytes */
    if (get_opcode_size)
        *size_out = opcode_len;
    return WALLY_OK;
}